

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O3

Vec_Int_t * Llb_Nonlin4CreateOrder(Aig_Man_t *pAig)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  int iVar4;
  uint in_EAX;
  uint uVar5;
  Vec_Int_t *vOrder;
  int *__s;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int Counter;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  iVar6 = pAig->vObjs->nSize;
  vOrder = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar7 = iVar6;
  }
  vOrder->nCap = iVar7;
  if (iVar7 == 0) {
    vOrder->pArray = (int *)0x0;
    vOrder->nSize = iVar6;
  }
  else {
    __s = (int *)malloc((long)iVar7 << 2);
    vOrder->pArray = __s;
    vOrder->nSize = iVar6;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)iVar6 << 2);
    }
  }
  Aig_ManIncrementTravId(pAig);
  pAig->pConst1->TravId = pAig->nTravIds;
  iVar6 = pAig->nRegs;
  if (0 < iVar6) {
    iVar7 = 0;
    do {
      uVar5 = pAig->nTruePos + iVar7;
      if (((int)uVar5 < 0) || (pAig->vCos->nSize <= (int)uVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAig->vCos->pArray[uVar5];
      iVar6 = *(int *)((long)pvVar1 + 0x24);
      iVar4 = uStack_28._4_4_;
      uStack_28 = CONCAT44(uStack_28._4_4_ + 1,(undefined4)uStack_28);
      if (((long)iVar6 < 0) || (vOrder->nSize <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vOrder->pArray[iVar6] = iVar4;
      Llb_Nonlin4CreateOrder_rec
                (pAig,(Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe),vOrder,
                 (int *)((long)&uStack_28 + 4));
      iVar7 = iVar7 + 1;
      iVar6 = pAig->nRegs;
    } while (iVar7 < iVar6);
  }
  pVVar2 = pAig->vCis;
  iVar7 = pVVar2->nSize;
  if (0 < iVar7) {
    ppvVar3 = pVVar2->pArray;
    lVar8 = 0;
    do {
      iVar6 = *(int *)((long)ppvVar3[lVar8] + 0x24);
      lVar9 = (long)iVar6;
      if ((lVar9 < 0) || (vOrder->nSize <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vOrder->pArray[lVar9] < 0) {
        iVar6 = uStack_28._4_4_;
        uStack_28 = CONCAT44(uStack_28._4_4_ + 1,(undefined4)uStack_28);
        vOrder->pArray[lVar9] = iVar6;
        iVar7 = pVVar2->nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar7);
    iVar6 = pAig->nRegs;
  }
  if (uStack_28._4_4_ <= iVar6 + pAig->nObjs[2]) {
    Aig_ManCleanMarkA(pAig);
    return vOrder;
  }
  __assert_fail("Counter <= Aig_ManCiNum(pAig) + Aig_ManRegNum(pAig) + (vNodes?Vec_IntSize(vNodes):0)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb4Nonlin.c"
                ,0x178,"Vec_Int_t *Llb_Nonlin4CreateOrder(Aig_Man_t *)");
}

Assistant:

Vec_Int_t * Llb_Nonlin4CreateOrder( Aig_Man_t * pAig )
{
    Vec_Int_t * vNodes = NULL;
    Vec_Int_t * vOrder;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
/*
    // mark internal nodes to be used
    Aig_ManCleanMarkA( pAig );
    vNodes = Llb_Nonlin4CollectHighRefNodes( pAig, 4 );
    Aig_ManForEachObjVec( vNodes, pAig, pObj, i )
        pObj->fMarkA = 1;
printf( "Techmapping added %d pivots.\n", Vec_IntSize(vNodes) );
*/
    // collect nodes in the order
    vOrder = Vec_IntStartFull( Aig_ManObjNumMax(pAig) );
    Aig_ManIncrementTravId( pAig );
    Aig_ObjSetTravIdCurrent( pAig, Aig_ManConst1(pAig) );
    Saig_ManForEachLi( pAig, pObj, i )
    {
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
        Llb_Nonlin4CreateOrder_rec( pAig, Aig_ObjFanin0(pObj), vOrder, &Counter );
    }
    Aig_ManForEachCi( pAig, pObj, i )
        if ( Llb_ObjBddVar(vOrder, pObj) < 0 )
        {
//            if ( Saig_ObjIsLo(pAig, pObj) )
//                Vec_IntWriteEntry( vOrder, Aig_ObjId(Saig_ObjLoToLi(pAig, pObj)), Counter++ );
            Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
        }
    assert( Counter <= Aig_ManCiNum(pAig) + Aig_ManRegNum(pAig) + (vNodes?Vec_IntSize(vNodes):0) );
    Aig_ManCleanMarkA( pAig );
    Vec_IntFreeP( &vNodes );
    return vOrder;
}